

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O0

ValueFunctionPOMDPDiscrete *
AlphaVectorPlanning::VectorSetToValueFunction(VectorSet *VS,Index a,BGPolicyIndex betaI)

{
  AlphaVector *nrS;
  AlphaVector *this;
  AlphaVector *this_00;
  value_type *j;
  value_type *__x;
  Index in_EDX;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_RSI;
  ValueFunctionPOMDPDiscrete *in_RDI;
  Index s;
  AlphaVector alpha;
  Index i;
  ValueFunctionPOMDPDiscrete *V;
  uint local_64;
  AlphaVector local_60;
  uint local_28;
  undefined1 local_21;
  Index local_14;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_10;
  
  local_21 = 0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x90ac20);
  local_28 = 0;
  while( true ) {
    nrS = (AlphaVector *)(ulong)local_28;
    this = (AlphaVector *)
           boost::numeric::ublas::
           matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           ::size1(local_10);
    if (nrS == this) break;
    this_00 = (AlphaVector *)
              boost::numeric::ublas::
              matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              ::size2(local_10);
    AlphaVector::AlphaVector(this,(size_t)nrS);
    AlphaVector::SetAction(&local_60,local_14);
    AlphaVector::SetBetaI(this,(BGPolicyIndex)nrS);
    local_64 = 0;
    while( true ) {
      j = (value_type *)(ulong)local_64;
      __x = (value_type *)
            boost::numeric::ublas::
            matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::size2(local_10);
      if (j == __x) break;
      boost::numeric::ublas::
      matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    *)this_00,(size_type)__x,(size_type)j);
      AlphaVector::SetValue(this_00,(double)__x,(Index)((ulong)j >> 0x20));
      local_64 = local_64 + 1;
    }
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)this_00,__x);
    AlphaVector::~AlphaVector((AlphaVector *)0x90ad6c);
    local_28 = local_28 + 1;
  }
  return in_RDI;
}

Assistant:

ValueFunctionPOMDPDiscrete
AlphaVectorPlanning::VectorSetToValueFunction(const VectorSet& VS,
                                              Index a,
                                              AlphaVector::BGPolicyIndex betaI)
{
    ValueFunctionPOMDPDiscrete V;

    for(Index i=0;i!=VS.size1();++i)
    {
        AlphaVector alpha(VS.size2());
        alpha.SetAction(a);
        alpha.SetBetaI(betaI);
        for(Index s=0;s!=VS.size2();++s)
            alpha.SetValue(VS(i,s),s);
        V.push_back(alpha);
    }
    return(V);
}